

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  undefined4 *puVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  Curl_easy *pCVar5;
  
  *done = false;
  pCVar5 = conn->data;
  CVar2 = Curl_urldecode(pCVar5,(pCVar5->state).up.path + 1,0,
                         (char **)((long)(pCVar5->req).protop + 8),(size_t *)0x0,true);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  pCVar5 = conn->data;
  pcVar4 = (pCVar5->set).str[6];
  if (pcVar4 != (char *)0x0) {
    CVar2 = Curl_urldecode(pCVar5,pcVar4,0,(char **)((long)(pCVar5->req).protop + 0x10),
                           (size_t *)0x0,true);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pCVar5 = conn->data;
  }
  (pCVar5->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar5,0);
  Curl_pgrsSetDownloadCounter(pCVar5,0);
  Curl_pgrsSetUploadSize(pCVar5,-1);
  Curl_pgrsSetDownloadSize(pCVar5,-1);
  pCVar5 = conn->data;
  puVar1 = (undefined4 *)(pCVar5->req).protop;
  if ((pCVar5->set).opt_no_body == true) {
    *puVar1 = 1;
  }
  *done = false;
  if (**(char **)(puVar1 + 2) == '\0') {
LAB_00131080:
    pcVar4 = *(char **)(puVar1 + 4);
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      pcVar4 = "LIST";
    }
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar4);
  }
  else {
    if ((pCVar5->set).ftp_list_only == true) {
      *puVar1 = 1;
      if (**(char **)(puVar1 + 2) == '\0') goto LAB_00131080;
      pcVar4 = "LIST";
    }
    else {
      pcVar4 = "RETR";
    }
    pcVar3 = *(char **)(puVar1 + 4);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      pcVar3 = pcVar4;
    }
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",pcVar3);
  }
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  (conn->proto).imapc.state = IMAP_FETCH;
  CVar2 = pop3_multi_statemach(conn,done);
  return CVar2;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = pop3_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = pop3_parse_custom_request(conn);
  if(result)
    return result;

  result = pop3_regular_transfer(conn, done);

  return result;
}